

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type_demotion.c
# Opt level: O1

value value_type_demotion_boolean(value v,type_id id)

{
  ulong uVar1;
  type_id id_00;
  int iVar2;
  size_t sVar3;
  value pvVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  anon_union_8_3_4e909c24 buffer;
  undefined8 local_20;
  
  local_20 = 0.0;
  id_00 = value_type_id(v);
  iVar2 = type_id_integer(id_00);
  if (((iVar2 != 0) && (iVar2 = type_id_decimal(id_00), iVar2 != 0)) ||
     (iVar2 = type_id_boolean(id), iVar2 != 0)) {
    return (value)0x0;
  }
  if (id_00 == id) {
    return v;
  }
  sVar3 = value_type_id_size(id_00);
  value_to(v,&local_20,sVar3);
  sVar3 = value_type_id_size(id);
  pvVar4 = value_type_create((void *)0x0,sVar3,id);
  if (pvVar4 == (value)0x0) {
    return v;
  }
  value_destroy(v);
  iVar2 = type_id_decimal(id_00);
  if (iVar2 == 0) {
    if (id_00 == 6) {
      bVar6 = NAN(local_20);
      bVar7 = local_20 == 0.0;
    }
    else {
      if (id_00 != 5) {
        return pvVar4;
      }
      bVar6 = NAN((float)local_20);
      bVar7 = (float)local_20 == 0.0;
    }
    if ((!bVar7) || (bVar6)) {
      pvVar4 = value_from_bool(pvVar4,'\x01');
      return pvVar4;
    }
  }
  else {
    if ((char)local_20 == '\0') {
      uVar1 = 0;
      do {
        uVar5 = uVar1;
        bVar6 = 6 < uVar5;
        if (uVar5 == 7) goto LAB_0010ad9e;
        uVar1 = uVar5 + 1;
      } while (*(char *)((long)&local_20 + uVar5 + 1) == '\0');
      bVar6 = 6 < uVar5;
    }
    else {
      bVar6 = false;
    }
    v = value_from_bool(pvVar4,'\x01');
LAB_0010ad9e:
    if (!bVar6) {
      return v;
    }
  }
  return pvVar4;
}

Assistant:

value value_type_demotion_boolean(value v, type_id id)
{
	union
	{
		char b[8];
		float f;
		double d;
	} buffer = {
		{ 0 }
	};

	value demotion = NULL;

	type_id v_id = value_type_id(v);

	if (!(type_id_integer(v_id) == 0 || type_id_decimal(v_id) == 0) || type_id_boolean(id) != 0)
	{
		return NULL;
	}

	if (v_id == id)
	{
		return v;
	}

	value_to(v, (void *)&buffer.b[0], value_type_id_size(v_id));

	demotion = value_type_create(NULL, value_type_id_size(id), id);

	if (demotion == NULL)
	{
		return v;
	}

	value_destroy(v);

	if (type_id_decimal(v_id) == 0)
	{
		if (v_id == TYPE_FLOAT)
		{
			if (buffer.f != 0.0f && buffer.f != -0.0f)
			{
				return value_from_bool(demotion, 1L);
			}
		}
		else if (v_id == TYPE_DOUBLE)
		{
			if (buffer.d != 0.0 && buffer.d != -0.0)
			{
				return value_from_bool(demotion, 1L);
			}
		}
		else
		{
			/* error */
		}
	}
	else
	{
		size_t iterator;

		for (iterator = 0; iterator < 8; ++iterator)
		{
			if (buffer.b[iterator] != 0x00)
			{
				return value_from_bool(demotion, 1L);
			}
		}
	}

	return demotion;
}